

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::fetchGatherArray2DOffsets
          (tcu *this,ConstPixelBufferAccess *src,Sampler *sampler,float s,float t,int depth,
          int componentNdx,IVec2 (*offsets) [4])

{
  uint uVar1;
  uint uVar2;
  WrapMode WVar3;
  int i_1;
  uint uVar4;
  uint uVar5;
  TextureChannelClass TVar6;
  long lVar7;
  int iVar8;
  int i;
  long lVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float in_XMM1_Db;
  float fVar15;
  Vector<float,_4> VVar16;
  Vec4 VVar17;
  Vec4 *result;
  TextureFormat local_68;
  int aiStack_60 [2];
  undefined1 local_58 [24];
  uint local_40 [4];
  
  uVar1 = (src->m_size).m_data[0];
  uVar2 = (src->m_size).m_data[1];
  WVar3 = sampler->wrapS;
  fVar11 = 0.0;
  if (WVar3 < WRAPMODE_LAST) {
    fVar11 = (float)(int)uVar1;
    if ((0x57U >> (WVar3 & 0x1f) & 1) == 0) {
      if (WVar3 == REPEAT_CL) {
        fVar13 = floorf(s);
        fVar11 = (s - fVar13) * fVar11;
      }
      else {
        fVar15 = s * 0.5;
        fVar13 = floorf(fVar15);
        fVar13 = fVar15 - fVar13;
        if ((fVar13 != 0.5) || (NAN(fVar13))) {
          fVar12 = floorf(fVar15 + 0.5);
        }
        else {
          fVar12 = 0.0;
          if (((long)(fVar15 - fVar13) & 1U) != 0) {
            fVar12 = 1.0;
          }
          fVar12 = (fVar15 - fVar13) + fVar12;
        }
        fVar13 = s - (fVar12 + fVar12);
        uVar10 = -(uint)(-fVar13 <= fVar13);
        fVar11 = (float)(~uVar10 & (uint)-fVar13 | (uint)fVar13 & uVar10) * fVar11;
      }
    }
    else {
      fVar11 = fVar11 * s;
    }
  }
  fVar15 = 0.0;
  WVar3 = sampler->wrapT;
  fVar13 = t;
  if (WVar3 < WRAPMODE_LAST) {
    fVar15 = (float)(int)uVar2;
    if ((0x57U >> (WVar3 & 0x1f) & 1) == 0) {
      if (WVar3 == REPEAT_CL) {
        fVar12 = floorf(t);
        fVar15 = (t - fVar12) * fVar15;
      }
      else {
        fVar13 = t * 0.5;
        fVar12 = floorf(fVar13);
        fVar12 = fVar13 - fVar12;
        if ((fVar12 != 0.5) || (NAN(fVar12))) {
          fVar14 = floorf(fVar13 + 0.5);
        }
        else {
          fVar14 = 0.0;
          if (((long)(fVar13 - fVar12) & 1U) != 0) {
            fVar14 = 1.0;
          }
          fVar14 = (fVar13 - fVar12) + fVar14;
        }
        fVar12 = t - (fVar14 + fVar14);
        uVar10 = -(uint)(-fVar12 <= fVar12);
        fVar13 = (float)((uint)fVar12 & uVar10);
        in_XMM1_Db = (float)((uint)in_XMM1_Db & (uint)-in_XMM1_Db);
        fVar15 = (float)(~uVar10 & (uint)-fVar12 | (uint)fVar13) * fVar15;
      }
    }
    else {
      fVar15 = fVar15 * t;
    }
  }
  fVar11 = floorf(fVar11 + -0.5);
  fVar15 = floorf(fVar15 + -0.5);
  *(undefined1 (*) [16])this = ZEXT416(0);
  lVar9 = 0;
  do {
    uVar10 = 0;
    if (sampler->wrapS < WRAPMODE_LAST) {
      uVar4 = (*offsets)[lVar9].m_data[0] + (int)fVar11;
      uVar10 = uVar4;
      switch(sampler->wrapS) {
      default:
        uVar10 = uVar1 - 1;
        if ((int)uVar4 < (int)(uVar1 - 1)) {
          uVar10 = uVar4;
        }
        if ((int)uVar4 < 0) {
          uVar10 = 0;
        }
        break;
      case CLAMP_TO_BORDER:
        uVar10 = uVar1;
        if ((int)uVar4 < (int)uVar1) {
          uVar10 = uVar4;
        }
        if ((int)uVar4 < -1) {
          uVar10 = 0xffffffff;
        }
        break;
      case REPEAT_GL:
      case REPEAT_CL:
        uVar10 = ((int)uVar4 % (int)uVar1 >> 0x1f & uVar1) + (int)uVar4 % (int)uVar1;
        break;
      case MIRRORED_ONCE:
        uVar10 = uVar1;
        if ((int)uVar4 < (int)uVar1) {
          uVar10 = uVar4;
        }
        if ((int)uVar4 < (int)-uVar1) {
          uVar10 = -uVar1;
        }
      case MIRRORED_REPEAT_GL:
        iVar8 = (int)uVar10 % (int)(uVar1 * 2);
        uVar10 = (iVar8 - uVar1) + (iVar8 >> 0x1f & uVar1 * 2);
        uVar10 = ~((int)uVar10 >> 0x1f ^ uVar10) + uVar1;
      }
    }
    if (sampler->wrapT < WRAPMODE_LAST) {
      uVar5 = (*offsets)[lVar9].m_data[1] + (int)fVar15;
      uVar4 = uVar5;
      switch(sampler->wrapT) {
      default:
        uVar4 = uVar2 - 1;
        if ((int)uVar5 < (int)(uVar2 - 1)) {
          uVar4 = uVar5;
        }
        if ((int)uVar5 < 0) {
          uVar4 = 0;
        }
        break;
      case CLAMP_TO_BORDER:
        uVar4 = uVar2;
        if ((int)uVar5 < (int)uVar2) {
          uVar4 = uVar5;
        }
        if ((int)uVar5 < -1) {
          uVar4 = 0xffffffff;
        }
        break;
      case REPEAT_GL:
      case REPEAT_CL:
        uVar4 = ((int)uVar5 % (int)uVar2 >> 0x1f & uVar2) + (int)uVar5 % (int)uVar2;
        break;
      case MIRRORED_ONCE:
        uVar4 = uVar2;
        if ((int)uVar5 < (int)uVar2) {
          uVar4 = uVar5;
        }
        if ((int)uVar5 < (int)-uVar2) {
          uVar4 = -uVar2;
        }
      case MIRRORED_REPEAT_GL:
        iVar8 = (int)uVar4 % (int)(uVar2 * 2);
        uVar4 = (iVar8 - uVar2) + (iVar8 >> 0x1f & uVar2 * 2);
        uVar4 = ~((int)uVar4 >> 0x1f ^ uVar4) + uVar2;
      }
    }
    else {
      uVar4 = 0;
    }
    local_58._0_4_ = R;
    local_58._4_4_ = SNORM_INT8;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    if (((int)uVar10 < (int)uVar1 && -1 < (int)uVar10) &&
       ((int)uVar4 < (int)uVar2 && -1 < (int)uVar4)) {
      VVar17 = lookup((ConstPixelBufferAccess *)local_58,(int)src,uVar10,uVar4);
      fVar13 = VVar17.m_data[2];
      in_XMM1_Db = VVar17.m_data[3];
    }
    else {
      TVar6 = getTextureChannelClass((src->m_format).type);
      switch(TVar6) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        VVar16 = sampleTextureBorder<float>((tcu *)&local_68,&src->m_format,sampler);
        fVar13 = VVar16.m_data[2];
        in_XMM1_Db = VVar16.m_data[3];
        break;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        sampleTextureBorder<int>((tcu *)local_40,&src->m_format,sampler);
        local_68.order = R;
        local_68.type = SNORM_INT8;
        aiStack_60[0] = 0;
        aiStack_60[1] = 0;
        lVar7 = 0;
        do {
          (&local_68.order)[lVar7] = (ChannelOrder)(float)(int)local_40[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        sampleTextureBorder<unsigned_int>((tcu *)local_40,&src->m_format,sampler);
        local_68.order = R;
        local_68.type = SNORM_INT8;
        aiStack_60[0] = 0;
        aiStack_60[1] = 0;
        lVar7 = 0;
        do {
          (&local_68.order)[lVar7] = (ChannelOrder)(float)local_40[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        break;
      default:
        lVar7 = 0;
        do {
          (&local_68.order)[lVar7] = 0xbf800000;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
      }
      local_58._0_4_ = local_68.order;
      local_58._4_4_ = local_68.type;
      local_58._8_4_ = aiStack_60[0];
      local_58._12_4_ = aiStack_60[1];
    }
    VVar17.m_data[1] = 0.0;
    VVar17.m_data[0] = (float)*(uint *)(local_58 + (long)componentNdx * 4);
    *(uint *)(this + lVar9 * 4) = *(uint *)(local_58 + (long)componentNdx * 4);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  VVar17.m_data[3] = in_XMM1_Db;
  VVar17.m_data[2] = fVar13;
  return (Vec4)VVar17.m_data;
}

Assistant:

static Vec4 fetchGatherArray2DOffsets (const ConstPixelBufferAccess& src, const Sampler& sampler, float s, float t, int depth, int componentNdx, const IVec2 (&offsets)[4])
{
	DE_ASSERT(de::inBounds(componentNdx, 0, 4));

	const int		w	= src.getWidth();
	const int		h	= src.getHeight();
	const float		u	= unnormalize(sampler.wrapS, s, w);
	const float		v	= unnormalize(sampler.wrapT, t, h);
	const int		x0	= deFloorFloatToInt32(u-0.5f);
	const int		y0	= deFloorFloatToInt32(v-0.5f);

	Vec4			result;

	for (int i = 0; i < 4; i++)
	{
		const int	sampleX	= wrap(sampler.wrapS, x0 + offsets[i].x(), w);
		const int	sampleY	= wrap(sampler.wrapT, y0 + offsets[i].y(), h);
		Vec4		pixel;

		if (deInBounds32(sampleX, 0, w) && deInBounds32(sampleY, 0, h))
			pixel = lookup(src, sampleX, sampleY, depth);
		else
			pixel = lookupBorder(src.getFormat(), sampler);

		result[i] = pixel[componentNdx];
	}

	return result;
}